

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_get_format_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  uint *puVar1;
  undefined8 *puVar2;
  uint8_t uVar3;
  short sVar4;
  uint32_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  uint8_t *puVar19;
  void *pvVar20;
  char cVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  undefined4 *puVar25;
  uint32_t *puVar26;
  int iVar27;
  bcf_fmt_t *pbVar28;
  size_t sVar29;
  char *pcVar30;
  uint *puVar31;
  char *pcVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  uint32_t uVar40;
  uint uVar41;
  ulong uVar42;
  anon_union_4_2_947300a4 u;
  uint uVar43;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  
  uVar16 = bcf_hdr_id2int(hdr,0,tag);
  sVar29 = 0xffffffff;
  if ((-1 < (int)uVar16) && (uVar17 = (hdr->id[0][uVar16].val)->info[2], (~uVar17 & 0xf) != 0)) {
    if ((*tag == 'G') && ((tag[1] == 'T' && (tag[2] == '\0')))) {
      sVar29 = 0xfffffffe;
      if ((uVar17 & 0xf0) != 0x30) goto LAB_00121038;
    }
    else {
      sVar29 = 0xfffffffe;
      if ((uVar17 >> 4 & 0xf) != type) goto LAB_00121038;
    }
    if ((line->unpacked & 8) == 0) {
      bcf_unpack(line,8);
    }
    uVar42 = *(ulong *)&line->field_0x10;
    uVar17 = (uint)(uVar42 >> 0x20) & 0xff;
    if ((uVar42 & 0xff00000000) == 0) {
      uVar24 = 0;
    }
    else {
      pbVar28 = (line->d).fmt;
      uVar24 = 0;
      do {
        if (pbVar28->id == uVar16) goto LAB_00120d59;
        uVar24 = uVar24 + 1;
        pbVar28 = pbVar28 + 1;
      } while ((uVar42 >> 0x20 & 0xff) != uVar24);
      uVar24 = (ulong)uVar17;
    }
LAB_00120d59:
    sVar29 = 0xfffffffd;
    if ((uint)uVar24 != uVar17) {
      uVar24 = uVar24 & 0xffffffff;
      pbVar28 = (line->d).fmt;
      if (type == 3) {
        sVar29 = (long)hdr->n[2] * (long)pbVar28[uVar24].n;
        iVar38 = (int)sVar29;
        if (*ndst < iVar38) {
          pvVar18 = realloc(*dst,sVar29);
          *dst = pvVar18;
          if (pvVar18 == (void *)0x0) {
            sVar29 = 0xfffffffc;
            goto LAB_00121038;
          }
          *ndst = iVar38;
        }
        memcpy(*dst,pbVar28[uVar24].p,(long)iVar38);
      }
      else {
        iVar38 = hdr->n[2];
        sVar29 = (long)pbVar28[uVar24].n * (long)iVar38;
        if (*ndst < (int)sVar29) {
          *ndst = (int)sVar29;
          sVar29 = sVar29 * 4;
          pvVar18 = realloc(*dst,sVar29);
          *dst = pvVar18;
        }
        uVar14 = bcf_float_vector_end;
        uVar13 = bcf_float_missing;
        iVar27 = (int)sVar29;
        puVar31 = (uint *)(ulong)(uint)pbVar28[uVar24].type;
        switch(pbVar28[uVar24].type) {
        case 1:
          if (0 < iVar38) {
            puVar19 = pbVar28[uVar24].p;
            puVar25 = (undefined4 *)*dst;
            iVar27 = 0;
            do {
              if (pbVar28[uVar24].n < 1) {
                uVar42 = 0;
              }
              else {
                lVar39 = 0;
                uVar42 = 0;
                do {
                  uVar3 = puVar19[uVar42];
                  iVar33 = -0x80000000;
                  if (uVar3 != 0x80) {
                    if (uVar3 == 0x81) {
                      puVar25[uVar42] = 0x80000001;
                      break;
                    }
                    iVar33 = (int)(char)uVar3;
                  }
                  puVar25[uVar42] = iVar33;
                  uVar42 = uVar42 + 1;
                  lVar39 = lVar39 + 4;
                } while ((long)uVar42 < (long)pbVar28[uVar24].n);
                puVar25 = (undefined4 *)((long)puVar25 + lVar39);
              }
              for (; (int)uVar42 < pbVar28[uVar24].n; uVar42 = (ulong)((int)uVar42 + 1)) {
                *puVar25 = 0x80000001;
                puVar25 = puVar25 + 1;
              }
              puVar19 = puVar19 + pbVar28[uVar24].size;
              iVar27 = iVar27 + 1;
            } while (iVar27 != iVar38);
          }
          break;
        case 2:
          if (0 < iVar38) {
            puVar19 = pbVar28[uVar24].p;
            puVar25 = (undefined4 *)*dst;
            iVar27 = 0;
            do {
              if (pbVar28[uVar24].n < 1) {
                uVar42 = 0;
              }
              else {
                lVar39 = 0;
                uVar42 = 0;
                do {
                  sVar4 = *(short *)(puVar19 + uVar42 * 2);
                  iVar33 = -0x80000000;
                  if (sVar4 != -0x8000) {
                    if (sVar4 == -0x7fff) {
                      puVar25[uVar42] = 0x80000001;
                      break;
                    }
                    iVar33 = (int)sVar4;
                  }
                  puVar25[uVar42] = iVar33;
                  uVar42 = uVar42 + 1;
                  lVar39 = lVar39 + 4;
                } while ((long)uVar42 < (long)pbVar28[uVar24].n);
                puVar25 = (undefined4 *)((long)puVar25 + lVar39);
              }
              for (; (int)uVar42 < pbVar28[uVar24].n; uVar42 = (ulong)((int)uVar42 + 1)) {
                *puVar25 = 0x80000001;
                puVar25 = puVar25 + 1;
              }
              puVar19 = puVar19 + pbVar28[uVar24].size;
              iVar27 = iVar27 + 1;
            } while (iVar27 != iVar38);
          }
          break;
        case 3:
          if (0 < iVar38) {
            puVar19 = pbVar28[uVar24].p;
            puVar25 = (undefined4 *)*dst;
            iVar27 = 0;
            do {
              if (pbVar28[uVar24].n < 1) {
                uVar42 = 0;
              }
              else {
                lVar39 = 0;
                uVar42 = 0;
                do {
                  if (*(int *)(puVar19 + uVar42 * 4) == -0x7fffffff) {
                    puVar25[uVar42] = 0x80000001;
                    break;
                  }
                  puVar25[uVar42] = *(int *)(puVar19 + uVar42 * 4);
                  uVar42 = uVar42 + 1;
                  lVar39 = lVar39 + 4;
                } while ((long)uVar42 < (long)pbVar28[uVar24].n);
                puVar25 = (undefined4 *)((long)puVar25 + lVar39);
              }
              for (; (int)uVar42 < pbVar28[uVar24].n; uVar42 = (ulong)((int)uVar42 + 1)) {
                *puVar25 = 0x80000001;
                puVar25 = puVar25 + 1;
              }
              puVar19 = puVar19 + pbVar28[uVar24].size;
              iVar27 = iVar27 + 1;
            } while (iVar27 != iVar38);
          }
          break;
        default:
          bcf_get_format_values_cold_1();
          uVar16 = iVar27 - 1U >> 1 | iVar27 - 1U;
          uVar16 = uVar16 >> 2 | uVar16;
          uVar16 = uVar16 >> 4 | uVar16;
          uVar16 = uVar16 >> 8 | uVar16;
          uVar16 = (uVar16 >> 0x10 | uVar16) + 1;
          uVar42 = 4;
          if (4 < uVar16) {
            uVar42 = (ulong)uVar16;
          }
          uVar17 = puVar31[1];
          pvVar18 = (void *)0x0;
          uVar43 = (uint)(long)((double)uVar42 * 0.77 + 0.5);
          uVar41 = (uint)uVar42;
          if (uVar17 < uVar43) {
            uVar23 = (uint)(uVar42 >> 2) & 0x3ffffffc;
            if (uVar16 < 0x10) {
              uVar23 = 4;
            }
            pvVar18 = malloc((ulong)uVar23);
            if (pvVar18 == (void *)0x0) {
              return -1;
            }
            memset(pvVar18,0xaa,(ulong)uVar23);
            if (*puVar31 < uVar41) {
              pvVar20 = realloc(*(void **)(puVar31 + 6),uVar42 * 8);
              if (pvVar20 == (void *)0x0) {
                free(pvVar18);
                return -1;
              }
              *(void **)(puVar31 + 6) = pvVar20;
              pvVar20 = realloc(*(void **)(puVar31 + 8),uVar42 * 0x30);
              if (pvVar20 == (void *)0x0) {
                free(pvVar18);
                return -1;
              }
              *(void **)(puVar31 + 8) = pvVar20;
            }
          }
          if (uVar17 < uVar43) {
            uVar16 = *puVar31;
            if (uVar16 != 0) {
              uVar17 = 0;
              do {
                uVar16 = *(uint *)(*(long *)(puVar31 + 4) + (ulong)(uVar17 >> 4) * 4);
                uVar23 = uVar17 * 2 & 0x1e;
                if ((uVar16 >> (sbyte)uVar23 & 3) == 0) {
                  pcVar30 = *(char **)(*(long *)(puVar31 + 6) + (ulong)uVar17 * 8);
                  lVar39 = *(long *)(puVar31 + 8);
                  lVar35 = (ulong)uVar17 * 0x30;
                  uStack_e0 = *(undefined8 *)(lVar39 + lVar35);
                  uStack_d8 = ((undefined8 *)(lVar39 + lVar35))[1];
                  puVar2 = (undefined8 *)(lVar39 + 0x10 + lVar35);
                  uStack_d0 = *puVar2;
                  uStack_c8 = puVar2[1];
                  puVar2 = (undefined8 *)(lVar39 + 0x20 + lVar35);
                  uStack_c0 = *puVar2;
                  uStack_b8 = puVar2[1];
                  *(uint *)(*(long *)(puVar31 + 4) + (ulong)(uVar17 >> 4) * 4) =
                       uVar16 | 1 << uVar23;
                  do {
                    uVar16 = (uint)*pcVar30;
                    if (*pcVar30 == '\0') {
                      uVar16 = 0;
                    }
                    else {
                      cVar21 = pcVar30[1];
                      if (cVar21 != '\0') {
                        pcVar32 = pcVar30 + 2;
                        do {
                          uVar16 = (int)cVar21 + uVar16 * 0x1f;
                          cVar21 = *pcVar32;
                          pcVar32 = pcVar32 + 1;
                        } while (cVar21 != '\0');
                      }
                    }
                    uVar16 = uVar16 & uVar41 - 1;
                    uVar24 = (ulong)(uVar16 >> 4);
                    uVar23 = *(uint *)((long)pvVar18 + uVar24 * 4);
                    bVar22 = (char)uVar16 * '\x02' & 0x1e;
                    uVar34 = 2 << bVar22;
                    if ((uVar34 & uVar23) == 0) {
                      iVar38 = 1;
                      do {
                        uVar16 = uVar16 + iVar38 & uVar41 - 1;
                        bVar22 = (char)uVar16 * '\x02' & 0x1e;
                        uVar34 = 2 << bVar22;
                        uVar24 = (ulong)(uVar16 >> 4);
                        uVar23 = *(uint *)((long)pvVar18 + uVar24 * 4);
                        iVar38 = iVar38 + 1;
                      } while ((uVar34 & uVar23) == 0);
                    }
                    *(uint *)((long)pvVar18 + uVar24 * 4) = ~uVar34 & uVar23;
                    if ((uVar16 < *puVar31) &&
                       ((*(uint *)(*(long *)(puVar31 + 4) + uVar24 * 4) >> bVar22 & 3) == 0)) {
                      uVar36 = (ulong)uVar16;
                      pcVar32 = *(char **)(*(long *)(puVar31 + 6) + uVar36 * 8);
                      *(char **)(*(long *)(puVar31 + 6) + uVar36 * 8) = pcVar30;
                      lVar39 = *(long *)(puVar31 + 8);
                      lVar35 = uVar36 * 0x30;
                      uVar6 = *(undefined8 *)(lVar39 + lVar35);
                      uVar7 = ((undefined8 *)(lVar39 + lVar35))[1];
                      puVar2 = (undefined8 *)(lVar39 + 0x10 + lVar35);
                      uVar8 = *puVar2;
                      uVar9 = puVar2[1];
                      puVar2 = (undefined8 *)(lVar39 + 0x20 + lVar35);
                      uVar10 = *puVar2;
                      uVar11 = puVar2[1];
                      puVar2 = (undefined8 *)(lVar39 + 0x20 + lVar35);
                      *puVar2 = uStack_c0;
                      puVar2[1] = uStack_b8;
                      puVar2 = (undefined8 *)(lVar39 + 0x10 + lVar35);
                      *puVar2 = uStack_d0;
                      puVar2[1] = uStack_c8;
                      *(undefined8 *)(lVar39 + lVar35) = uStack_e0;
                      ((undefined8 *)(lVar39 + lVar35))[1] = uStack_d8;
                      puVar1 = (uint *)(*(long *)(puVar31 + 4) + uVar24 * 4);
                      *puVar1 = *puVar1 | 1 << bVar22;
                      bVar12 = true;
                      uStack_e0 = uVar6;
                      uStack_d8 = uVar7;
                      uStack_d0 = uVar8;
                      uStack_c8 = uVar9;
                      uStack_c0 = uVar10;
                      uStack_b8 = uVar11;
                    }
                    else {
                      *(char **)(*(long *)(puVar31 + 6) + (ulong)uVar16 * 8) = pcVar30;
                      lVar39 = *(long *)(puVar31 + 8);
                      lVar35 = (ulong)uVar16 * 0x30;
                      puVar2 = (undefined8 *)(lVar39 + 0x20 + lVar35);
                      *puVar2 = uStack_c0;
                      puVar2[1] = uStack_b8;
                      puVar2 = (undefined8 *)(lVar39 + 0x10 + lVar35);
                      *puVar2 = uStack_d0;
                      puVar2[1] = uStack_c8;
                      *(undefined8 *)(lVar39 + lVar35) = uStack_e0;
                      ((undefined8 *)(lVar39 + lVar35))[1] = uStack_d8;
                      bVar12 = false;
                      pcVar32 = pcVar30;
                    }
                    pcVar30 = pcVar32;
                  } while (bVar12);
                }
                uVar17 = uVar17 + 1;
                uVar16 = *puVar31;
              } while (uVar17 != uVar16);
            }
            if (uVar41 < uVar16) {
              pvVar20 = realloc(*(void **)(puVar31 + 6),uVar42 * 8);
              *(void **)(puVar31 + 6) = pvVar20;
              pvVar20 = realloc(*(void **)(puVar31 + 8),uVar42 * 0x30);
              *(void **)(puVar31 + 8) = pvVar20;
            }
            free(*(void **)(puVar31 + 4));
            *(void **)(puVar31 + 4) = pvVar18;
            *puVar31 = uVar41;
            puVar31[2] = puVar31[1];
            puVar31[3] = uVar43;
          }
          return 0;
        case 5:
          if (0 < iVar38) {
            puVar19 = pbVar28[uVar24].p;
            puVar26 = (uint32_t *)*dst;
            uVar16 = pbVar28[uVar24].n;
            iVar27 = pbVar28[uVar24].size;
            iVar33 = 0;
            do {
              uVar15 = bcf_float_vector_end;
              if ((int)uVar16 < 1) {
                iVar37 = 0;
              }
              else {
                lVar39 = 0;
                uVar42 = 0;
                do {
                  uVar5 = *(uint32_t *)(puVar19 + uVar42 * 4);
                  uVar40 = uVar13;
                  if ((uVar13 != uVar5) && (uVar40 = uVar5, uVar15 == uVar5)) {
                    puVar26[uVar42] = uVar15;
                    break;
                  }
                  puVar26[uVar42] = uVar40;
                  uVar42 = uVar42 + 1;
                  lVar39 = lVar39 + -4;
                } while (uVar16 != uVar42);
                iVar37 = (int)uVar42;
                puVar26 = (uint32_t *)((long)puVar26 - lVar39);
              }
              if (iVar37 < (int)uVar16) {
                iVar37 = uVar16 - iVar37;
                do {
                  *puVar26 = uVar14;
                  puVar26 = puVar26 + 1;
                  iVar37 = iVar37 + -1;
                } while (iVar37 != 0);
              }
              puVar19 = puVar19 + iVar27;
              iVar33 = iVar33 + 1;
            } while (iVar33 != iVar38);
          }
        }
        sVar29 = (size_t)(uint)(iVar38 * pbVar28[uVar24].n);
      }
    }
  }
LAB_00121038:
  return (int)sVar29;
}

Assistant:

int bcf_get_format_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( tag[0]=='G' && tag[1]=='T' && tag[2]==0 )
    {
        // Ugly: GT field is considered to be a string by the VCF header but BCF represents it as INT.
        if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;
    }
    else if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    if ( type==BCF_HT_STR )
    {
        int n = fmt->n*bcf_hdr_nsamples(hdr);
        if ( *ndst < n )
        {
            *dst  = realloc(*dst, n);
            if ( !*dst ) return -4;     // could not alloc
            *ndst = n;
        }
        memcpy(*dst,fmt->p,n);
        return n;
    }

    // Make sure the buffer is big enough
    int nsmpl = bcf_hdr_nsamples(hdr);
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < fmt->n*nsmpl )
    {
        *ndst = fmt->n*nsmpl;
        *dst  = realloc(*dst, *ndst*size1);
        if ( !dst ) return -4;     // could not alloc
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, set_vector_end, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t*) fmt->p; \
        for (i=0; i<nsmpl; i++) \
        { \
            for (j=0; j<fmt->n; j++) \
            { \
                if ( is_missing ) set_missing; \
                else if ( is_vector_end ) { set_vector_end; break; } \
                else *tmp = p[j]; \
                tmp++; \
            } \
            for (; j<fmt->n; j++) { set_vector_end; tmp++; } \
            p = (type_t *)((char *)p + fmt->size); \
        } \
    }
    switch (fmt->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), bcf_float_set_vector_end(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. fmt->type=%d\n", __FILE__,__LINE__, fmt->type); exit(1);
    }
    #undef BRANCH
    return nsmpl*fmt->n;
}